

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue4f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y,float z,float w)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[4]> state;
  StateQueryMemoryWriteGuard<float[4]> local_1c8;
  undefined1 local_190 [384];
  
  local_1c8.m_postguard[0] = -8.0297587e+18;
  local_1c8.m_postguard[1] = -8.0297587e+18;
  local_1c8.m_postguard[2] = -8.0297587e+18;
  local_1c8.m_postguard[3] = -8.0297587e+18;
  local_1c8.m_value[0] = -8.0297587e+18;
  local_1c8.m_value[1] = -8.0297587e+18;
  local_1c8.m_value[2] = -8.0297587e+18;
  local_1c8.m_value[3] = -8.0297587e+18;
  local_1c8.m_preguard[0] = -8.0297587e+18;
  local_1c8.m_preguard[1] = -8.0297587e+18;
  local_1c8.m_preguard[2] = -8.0297587e+18;
  local_1c8.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,local_1c8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&local_1c8,testCtx);
  if (bVar1) {
    if ((local_1c8.m_value[0] == x) && (!NAN(local_1c8.m_value[0]) && !NAN(x))) {
      if ((local_1c8.m_value[1] == y) && (!NAN(local_1c8.m_value[1]) && !NAN(y))) {
        if ((local_1c8.m_value[2] == z) && (!NAN(local_1c8.m_value[2]) && !NAN(z))) {
          if ((local_1c8.m_value[3] == w) && (!NAN(local_1c8.m_value[3]) && !NAN(w))) {
            return;
          }
        }
      }
    }
    local_190._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: expected [",0x14);
    std::ostream::_M_insert<double>((double)x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)z);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)w);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]; got [",8);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue4f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y, float z, float w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}